

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void llvm::cl::tokenizeConfigFile
               (StringRef Source,StringSaver *Saver,SmallVectorImpl<const_char_*> *NewArgv,
               bool MarkEOLs)

{
  ulong uVar1;
  byte *in_start;
  undefined1 in_R9B;
  byte *in_end;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  StringRef Src;
  SmallString<128U> Line;
  SmallVectorImpl<char> local_c0;
  cl local_b0 [128];
  
  in_start = (byte *)Source.Data;
  pbVar4 = in_start + Source.Length;
  do {
    if (in_start == pbVar4) {
      return;
    }
    local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = local_b0;
    local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = 0;
    local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Capacity = 0x80;
    uVar1 = (ulong)*in_start;
    in_end = in_start;
    if (uVar1 < 0x24) {
      if ((0x100002600U >> (uVar1 & 0x3f) & 1) == 0) {
        if (uVar1 != 0x23) goto LAB_00139ee8;
        for (; (in_start != pbVar4 && (*in_start != 10)); in_start = in_start + 1) {
        }
      }
      else {
        while (((in_start != pbVar4 && ((ulong)*in_start < 0x21)) &&
               ((0x100002600U >> ((ulong)*in_start & 0x3f) & 1) != 0))) {
          in_start = in_start + 1;
        }
      }
    }
    else {
LAB_00139ee8:
      while (in_end != pbVar4) {
        pbVar3 = in_end;
        if (*in_end == 0x5c) {
          pbVar2 = in_end + 1;
          if ((pbVar2 != pbVar4) &&
             ((*pbVar2 == 10 ||
              (((pbVar3 = pbVar2, *pbVar2 == 0xd && (in_end + 2 != pbVar4)) && (in_end[2] == 10)))))
             ) {
            SmallVectorImpl<char>::append<char_const*,void>
                      (&local_c0,(char *)in_start,(char *)in_end);
            if (in_end[1] == 0xd) {
              pbVar2 = in_end + 2;
            }
            in_start = pbVar2 + 1;
            pbVar3 = pbVar2;
          }
        }
        else if (*in_end == 10) break;
        in_end = pbVar3 + 1;
      }
      SmallVectorImpl<char>::append<char_const*,void>(&local_c0,(char *)in_start,(char *)in_end);
      Src.Data = (char *)(local_c0.super_SmallVectorTemplateBase<char,_true>.
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                         0xffffffff);
      Src.Length = (size_t)Saver;
      TokenizeGNUCommandLine
                ((cl *)local_c0.super_SmallVectorTemplateBase<char,_true>.
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,Src,
                 (StringSaver *)NewArgv,(SmallVectorImpl<const_char_*> *)(ulong)MarkEOLs,
                 (bool)in_R9B);
      in_start = in_end;
    }
    SmallVectorImpl<char>::~SmallVectorImpl(&local_c0);
  } while( true );
}

Assistant:

void cl::tokenizeConfigFile(StringRef Source, StringSaver &Saver,
                            SmallVectorImpl<const char *> &NewArgv,
                            bool MarkEOLs) {
  for (const char *Cur = Source.begin(); Cur != Source.end();) {
    SmallString<128> Line;
    // Check for comment line.
    if (isWhitespace(*Cur)) {
      while (Cur != Source.end() && isWhitespace(*Cur))
        ++Cur;
      continue;
    }
    if (*Cur == '#') {
      while (Cur != Source.end() && *Cur != '\n')
        ++Cur;
      continue;
    }
    // Find end of the current line.
    const char *Start = Cur;
    for (const char *End = Source.end(); Cur != End; ++Cur) {
      if (*Cur == '\\') {
        if (Cur + 1 != End) {
          ++Cur;
          if (*Cur == '\n' ||
              (*Cur == '\r' && (Cur + 1 != End) && Cur[1] == '\n')) {
            Line.append(Start, Cur - 1);
            if (*Cur == '\r')
              ++Cur;
            Start = Cur + 1;
          }
        }
      } else if (*Cur == '\n')
        break;
    }
    // Tokenize line.
    Line.append(Start, Cur);
    cl::TokenizeGNUCommandLine(Line, Saver, NewArgv, MarkEOLs);
  }
}